

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

_Bool calc_do_split_flag(AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,RD_STATS *none_rdc,
                        CommonModeInfoParams *mi_params,int mi_row,int mi_col,int hbs,
                        BLOCK_SIZE bsize,PARTITION_TYPE partition)

{
  bool bVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  double curr_per_pixel_error;
  uint curr_uint_var;
  uint curr_uint_mse;
  buf_2d *pred_none_buf_2d;
  buf_2d *src_none_buf_2d;
  buf_2d pred_split_buf_2d;
  buf_2d src_split_buf_2d;
  int y_idx;
  int x_idx;
  int i;
  double max_per_pixel_error;
  double min_per_pixel_error;
  BLOCK_SIZE subsize;
  int use_model_yrd_large;
  _Bool do_split;
  MACROBLOCKD *xd;
  int is_larger_qindex;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffef4;
  MACROBLOCKD *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  buf_2d *in_stack_ffffffffffffff10;
  bool local_e2;
  double in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff28;
  undefined1 local_d4 [4];
  scale_factors *in_stack_ffffffffffffff30;
  int subsampling_x;
  int in_stack_ffffffffffffff40;
  undefined4 uStack_bc;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_88;
  uint local_74;
  double local_70;
  double local_68;
  bool local_1;
  
  bVar1 = 100 < (int)in_RDI[0x783d];
  if ((int)in_RDI[0xc194] == 3) {
    local_1 = true;
    if (9 < in_stack_00000018) {
      local_e2 = bVar1 && in_stack_00000018 < 0xd;
      local_1 = local_e2;
    }
  }
  else {
    local_1 = true;
  }
  if ((((*(int *)((long)in_RDI + 0x4269c) != 1) && (1 < (int)in_RDI[0xc194])) &&
      (iVar3 = cyclic_refresh_segment_id_boosted
                         ((uint)((byte)*(undefined2 *)(**(long **)(in_RSI + 0x2058) + 0xa7) & 7)),
      iVar3 == 0)) && (*(char *)(in_RCX + 0x20) != '\0')) {
    iVar3 = get_model_rd_flag((AV1_COMP *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8,
                              (BLOCK_SIZE)((uint)in_stack_fffffffffffffef4 >> 0x18));
    if ((iVar3 == 0) || (!bVar1)) {
      local_1 = false;
    }
    else if (((*(char *)(*(long *)(in_RDX + 8) + 2) == '\x10') && (in_stack_00000018 == 9)) &&
            (local_1)) {
      BVar2 = get_partition_subsize
                        ((BLOCK_SIZE)((uint)in_stack_fffffffffffffef4 >> 0x10),
                         (PARTITION_TYPE)((uint)in_stack_fffffffffffffef4 >> 8));
      local_68 = 1.79769313486232e+308;
      local_70 = 0.0;
      for (local_74 = 0;
          ((iVar3 = SUB84(in_stack_ffffffffffffff20,0), (int)local_74 < 4 &&
           (in_R9D + ((int)local_74 >> 1) * in_stack_00000010 < *(int *)(in_R8 + 0xc))) &&
          ((int)(in_stack_00000008 + (local_74 & 1) * in_stack_00000010) < *(int *)(in_R8 + 0x10)));
          local_74 = local_74 + 1) {
        subsampling_x = (int)in_RSI + 0x30;
        setup_pred_plane(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                         (uint8_t *)((ulong)in_stack_ffffffffffffff04 << 0x20),0,0,
                         in_stack_fffffffffffffef4,iVar3,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff30,subsampling_x,in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff30 = (scale_factors *)(in_RSI + 0x1c0);
        setup_pred_plane(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                         (uint8_t *)((ulong)in_stack_ffffffffffffff04 << 0x20),0,0,
                         in_stack_fffffffffffffef4,iVar3,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff30,subsampling_x,in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff28 =
             (**(code **)(*in_RDI + 0xc918 + (ulong)BVar2 * 0x70))
                       (local_a0,local_88,CONCAT44(uStack_bc,in_stack_ffffffffffffff40),local_a8,
                        local_d4);
        in_stack_ffffffffffffff20 =
             sqrt(((double)in_stack_ffffffffffffff28 / (double)block_size_wide[BVar2]) /
                  (double)block_size_high[BVar2]);
        if (in_stack_ffffffffffffff20 < local_68) {
          local_68 = in_stack_ffffffffffffff20;
        }
        if (local_70 < in_stack_ffffffffffffff20) {
          local_70 = in_stack_ffffffffffffff20;
        }
      }
      if (local_74 == 4) {
        local_1 = 1.5 < local_70 - local_68 && local_1;
      }
    }
  }
  return local_1;
}

Assistant:

static bool calc_do_split_flag(const AV1_COMP *cpi, const MACROBLOCK *x,
                               const PC_TREE *pc_tree, const RD_STATS *none_rdc,
                               const CommonModeInfoParams *mi_params,
                               int mi_row, int mi_col, int hbs,
                               BLOCK_SIZE bsize, PARTITION_TYPE partition) {
  const AV1_COMMON *const cm = &cpi->common;
  const int is_larger_qindex = cm->quant_params.base_qindex > 100;
  const MACROBLOCKD *const xd = &x->e_mbd;
  bool do_split =
      (cpi->sf.rt_sf.nonrd_check_partition_merge_mode == 3)
          ? (bsize <= BLOCK_32X32 || (is_larger_qindex && bsize <= BLOCK_64X64))
          : true;
  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN ||
      cpi->sf.rt_sf.nonrd_check_partition_merge_mode < 2 ||
      cyclic_refresh_segment_id_boosted(xd->mi[0]->segment_id) ||
      !none_rdc->skip_txfm)
    return do_split;

  const int use_model_yrd_large = get_model_rd_flag(cpi, xd, bsize);

  // When model based skip is not used (i.e.,use_model_yrd_large = 0), skip_txfm
  // would have been populated based on Hadamard transform and skip_txfm flag is
  // more reliable. Hence SPLIT evaluation is disabled at all quantizers for 8x8
  // and 16x16 blocks.
  // When model based skip is used (i.e.,use_model_yrd_large = 1), skip_txfm may
  // not be reliable. Hence SPLIT evaluation is disabled only at lower
  // quantizers for blocks >= 32x32.
  if ((!use_model_yrd_large) || (!is_larger_qindex)) return false;

  // Use residual statistics to decide if SPLIT partition should be evaluated
  // for 32x32 blocks. The pruning logic is avoided for larger block size to
  // avoid the visual artifacts
  if (pc_tree->none->mic.mode == NEWMV && bsize == BLOCK_32X32 && do_split) {
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
    assert(subsize < BLOCK_SIZES_ALL);
    double min_per_pixel_error = DBL_MAX;
    double max_per_pixel_error = 0.;
    int i;
    for (i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      const int x_idx = (i & 1) * hbs;
      const int y_idx = (i >> 1) * hbs;
      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols)) {
        break;
      }

      // Populate the appropriate buffer pointers.
      // Pass scale factors as NULL as the base pointer of the block would have
      // been calculated appropriately.
      struct buf_2d src_split_buf_2d, pred_split_buf_2d;
      const struct buf_2d *src_none_buf_2d = &x->plane[AOM_PLANE_Y].src;
      setup_pred_plane(&src_split_buf_2d, subsize, src_none_buf_2d->buf,
                       src_none_buf_2d->width, src_none_buf_2d->height,
                       src_none_buf_2d->stride, y_idx, x_idx, NULL, 0, 0);
      const struct buf_2d *pred_none_buf_2d = &xd->plane[AOM_PLANE_Y].dst;
      setup_pred_plane(&pred_split_buf_2d, subsize, pred_none_buf_2d->buf,
                       pred_none_buf_2d->width, pred_none_buf_2d->height,
                       pred_none_buf_2d->stride, y_idx, x_idx, NULL, 0, 0);

      unsigned int curr_uint_mse;
      const unsigned int curr_uint_var = cpi->ppi->fn_ptr[subsize].vf(
          src_split_buf_2d.buf, src_split_buf_2d.stride, pred_split_buf_2d.buf,
          pred_split_buf_2d.stride, &curr_uint_mse);
      const double curr_per_pixel_error =
          sqrt((double)curr_uint_var / block_size_wide[subsize] /
               block_size_high[subsize]);
      if (curr_per_pixel_error < min_per_pixel_error)
        min_per_pixel_error = curr_per_pixel_error;
      if (curr_per_pixel_error > max_per_pixel_error)
        max_per_pixel_error = curr_per_pixel_error;
    }

    // Prune based on residual statistics only if all the sub-partitions are
    // valid.
    if (i == SUB_PARTITIONS_SPLIT) {
      if (max_per_pixel_error - min_per_pixel_error <= 1.5) do_split = false;
    }
  }

  return do_split;
}